

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash_ssse3.c
# Opt level: O2

uint64_t siphash(uchar *key,uchar *m,size_t len)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar7._8_8_ = *(undefined8 *)key;
  auVar7._0_8_ = *(undefined8 *)key;
  uVar2 = 0;
  auVar5 = auVar7 ^ s_uespemosarenegylmodnarodsetybdet_001959d0._0_16_;
  auVar6._8_8_ = *(undefined8 *)(key + 8);
  auVar6._0_8_ = *(undefined8 *)(key + 8);
  auVar6 = auVar6 ^ s_uespemosarenegylmodnarodsetybdet_001959d0._16_16_;
  auVar7 = vpmovsxbw_avx(ZEXT816(0xe0d0c0f03020100));
  while (auVar4 = vprolq_avx512vl(auVar6,0xd), uVar2 < (len & 0xfffffffffffffff8)) {
    puVar1 = (ulong *)(m + uVar2);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *puVar1;
    uVar2 = uVar2 + 8;
    auVar8 = vpslldq_avx(auVar8,8);
    auVar4 = vpermt2w_avx512vl(auVar4,auVar7,auVar6 ^ auVar8);
    auVar6 = vpaddq_avx(auVar6 ^ auVar8,auVar5);
    auVar4 = auVar4 ^ auVar6;
    auVar6 = vpshufd_avx(auVar6,0x1e);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar8 = vprolq_avx512vl(auVar4,0x11);
    auVar6 = vpaddq_avx(auVar4,auVar6);
    auVar4 = vprolq_avx512vl(auVar5,0x15);
    auVar5 = vpshufd_avx(auVar6,0x1e);
    auVar4 = vpunpcklqdq_avx(auVar8,auVar4);
    auVar4 = auVar4 ^ auVar6;
    auVar8 = vprolq_avx512vl(auVar4,0xd);
    auVar6 = vpaddq_avx(auVar4,auVar5);
    auVar5 = vpermt2w_avx512vl(auVar8,auVar7,auVar4);
    auVar5 = auVar5 ^ auVar6;
    auVar6 = vpshufd_avx(auVar6,0x1e);
    auVar4 = vpshufd_avx(auVar5,0xee);
    auVar8 = vprolq_avx512vl(auVar5,0x11);
    auVar5 = vpaddq_avx(auVar5,auVar6);
    auVar6 = vprolq_avx512vl(auVar4,0x15);
    auVar4 = vpshufd_avx(auVar5,0x1e);
    auVar6 = vpunpcklqdq_avx(auVar8,auVar6);
    auVar6 = auVar6 ^ auVar5;
    auVar5._0_8_ = *puVar1 ^ auVar4._0_8_;
    auVar5._8_8_ = auVar4._8_8_;
  }
  uVar3 = len << 0x38;
  switch((uint)len & 7) {
  case 7:
    uVar3 = uVar3 | (ulong)m[uVar2 + 6] << 0x30;
  case 6:
    uVar3 = uVar3 | (ulong)m[uVar2 + 5] << 0x28;
  case 5:
    uVar3 = uVar3 | (ulong)m[uVar2 + 4] << 0x20;
  case 4:
    uVar3 = uVar3 | (ulong)m[uVar2 + 3] << 0x18;
  case 3:
    uVar3 = uVar3 | (ulong)m[uVar2 + 2] << 0x10;
  case 2:
    uVar3 = uVar3 | (ulong)m[uVar2 + 1] << 8;
  case 1:
    uVar2 = (ulong)m[uVar2];
    uVar3 = uVar3 | uVar2;
  case 0:
    auVar8 = vpunpckldq_avx(ZEXT416((uint)uVar3),ZEXT416((uint)(uVar3 >> 0x20)));
    auVar9 = vpslldq_avx(auVar8,8);
    auVar4 = vpermt2w_avx512vl(auVar4,auVar7,auVar6 ^ auVar9);
    auVar6 = vpaddq_avx(auVar6 ^ auVar9,auVar5);
    auVar4 = auVar4 ^ auVar6;
    auVar6 = vpshufd_avx(auVar6,0x1e);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar9 = vprolq_avx512vl(auVar4,0x11);
    auVar6 = vpaddq_avx(auVar4,auVar6);
    auVar4 = vprolq_avx512vl(auVar5,0x15);
    auVar5 = vpshufd_avx(auVar6,0x1e);
    auVar4 = vpunpcklqdq_avx(auVar9,auVar4);
    auVar4 = auVar4 ^ auVar6;
    auVar9 = vprolq_avx512vl(auVar4,0xd);
    auVar6 = vpaddq_avx(auVar4,auVar5);
    auVar4 = vpermt2w_avx512vl(auVar9,auVar7,auVar4);
    auVar4 = auVar4 ^ auVar6;
    auVar6 = vpshufd_avx(auVar6,0x1e);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar9 = vprolq_avx512vl(auVar4,0x11);
    auVar6 = vpaddq_avx(auVar4,auVar6);
    auVar4 = vprolq_avx512vl(auVar5,0x15);
    auVar5 = vpshufd_avx(auVar6,0x1e);
    auVar8 = vpternlogq_avx512vl(auVar5,auVar8,_DAT_00195a00,0x96);
    auVar5 = vpunpcklqdq_avx(auVar9,auVar4);
    auVar5 = auVar5 ^ auVar6;
    auVar6 = vprolq_avx512vl(auVar5,0xd);
    auVar4 = vpermt2w_avx512vl(auVar6,auVar7,auVar5);
    auVar6 = vpaddq_avx(auVar8,auVar5);
    auVar4 = auVar4 ^ auVar6;
    auVar6 = vpshufd_avx(auVar6,0x1e);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar8 = vprolq_avx512vl(auVar4,0x11);
    auVar6 = vpaddq_avx(auVar4,auVar6);
    auVar4 = vprolq_avx512vl(auVar5,0x15);
    auVar5 = vpshufd_avx(auVar6,0x1e);
    auVar4 = vpunpcklqdq_avx(auVar8,auVar4);
    auVar4 = auVar4 ^ auVar6;
    auVar8 = vprolq_avx512vl(auVar4,0xd);
    auVar6 = vpaddq_avx(auVar4,auVar5);
    auVar4 = vpermt2w_avx512vl(auVar8,auVar7,auVar4);
    auVar4 = auVar4 ^ auVar6;
    auVar6 = vpshufd_avx(auVar6,0x1e);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar8 = vprolq_avx512vl(auVar4,0x11);
    auVar6 = vpaddq_avx(auVar4,auVar6);
    auVar4 = vprolq_avx512vl(auVar5,0x15);
    auVar5 = vpshufd_avx(auVar6,0x1e);
    auVar4 = vpunpcklqdq_avx(auVar8,auVar4);
    auVar4 = auVar4 ^ auVar6;
    auVar8 = vprolq_avx512vl(auVar4,0xd);
    auVar6 = vpaddq_avx(auVar4,auVar5);
    auVar4 = vpermt2w_avx512vl(auVar8,auVar7,auVar4);
    auVar4 = auVar4 ^ auVar6;
    auVar6 = vpshufd_avx(auVar6,0x1e);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar8 = vprolq_avx512vl(auVar4,0x11);
    auVar6 = vpaddq_avx(auVar4,auVar6);
    auVar4 = vprolq_avx512vl(auVar5,0x15);
    auVar5 = vpshufd_avx(auVar6,0x1e);
    auVar4 = vpunpcklqdq_avx(auVar8,auVar4);
    auVar4 = auVar4 ^ auVar6;
    auVar8 = vprolq_avx512vl(auVar4,0xd);
    auVar6 = vpaddq_avx(auVar4,auVar5);
    auVar5 = vpermt2w_avx512vl(auVar8,auVar7,auVar4);
    auVar7 = vpshufd_avx(auVar6,0x1e);
    auVar5 = auVar5 ^ auVar6;
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar4 = vprolq_avx512vl(auVar5,0x11);
    auVar7 = vpaddq_avx(auVar5,auVar7);
    auVar5 = vprolq_avx512vl(auVar6,0x15);
    auVar6 = vpshufd_avx(auVar7,0x1e);
    auVar5 = vpunpcklqdq_avx(auVar4,auVar5);
    auVar6 = vpternlogq_avx512vl(auVar6,auVar7,auVar5,0x96);
    auVar7 = vpshufd_avx(auVar6,0xee);
    return CONCAT44((int)(uVar2 >> 0x20),SUB164(auVar7 ^ auVar6,0)) |
           (ulong)SUB164(auVar7 ^ auVar6,4) << 0x20;
  }
}

Assistant:

uint64_t
siphash(const unsigned char key[16], const unsigned char *m, size_t len) {
	xmmi k,v02,v20,v13,v11,v33,mi;
	uint64_t last7;
	uint32_t lo, hi;
	size_t i, blocks;

	k = _mm_loadu_si128((xmmi *)(key + 0));
	v02 = siphash_init[0].v;
	v13 = siphash_init[1].v;
	v02 = _mm_xor_si128(v02, _mm_unpacklo_epi64(k, k));
	v13 = _mm_xor_si128(v13, _mm_unpackhi_epi64(k, k));

	last7 = (uint64_t)(len & 0xff) << 56;

#define sipcompress() \
	v11 = v13; \
	v33 = v13; \
	v11 = _mm_or_si128(_mm_slli_epi64(v11, 13), _mm_srli_epi64(v11, 64-13)); \
	v02 = _mm_add_epi64(v02, v13); \
	v33 = _mm_shuffle_epi8(v33, siphash_rot16v3.v); \
	v13 = _mm_unpacklo_epi64(v11, v33); \
	v13 = _mm_xor_si128(v13, v02); \
	v20 = _mm_shuffle_epi32(v02, _MM_SHUFFLE(0,1,3,2)); \
	v11 = v13; \
	v33 = _mm_shuffle_epi32(v13, _MM_SHUFFLE(1,0,3,2)); \
	v11 = _mm_or_si128(_mm_slli_epi64(v11, 17), _mm_srli_epi64(v11, 64-17)); \
	v20 = _mm_add_epi64(v20, v13); \
	v33 = _mm_or_si128(_mm_slli_epi64(v33, 21), _mm_srli_epi64(v33, 64-21)); \
	v13 = _mm_unpacklo_epi64(v11, v33); \
	v13 = _mm_unpacklo_epi64(v11, v33); \
	v02 = _mm_shuffle_epi32(v20, _MM_SHUFFLE(0,1,3,2)); \
	v13 = _mm_xor_si128(v13, v20);

	for (i = 0, blocks = (len & ~7); i < blocks; i += 8) {
		mi = _mm_loadl_epi64((xmmi *)(m + i));
		v13 = _mm_xor_si128(v13, _mm_slli_si128(mi, 8));
		sipcompress()
		sipcompress()
		v02 = _mm_xor_si128(v02, mi);
	}

	switch (len - blocks) {
		case 7: last7 |= (uint64_t)m[i + 6] << 48;
		case 6: last7 |= (uint64_t)m[i + 5] << 40;
		case 5: last7 |= (uint64_t)m[i + 4] << 32;
		case 4: last7 |= (uint64_t)m[i + 3] << 24;
		case 3: last7 |= (uint64_t)m[i + 2] << 16;
		case 2: last7 |= (uint64_t)m[i + 1] <<  8;
		case 1: last7 |= (uint64_t)m[i + 0]      ;
		case 0:
		default:;
	};

	mi = _mm_unpacklo_epi32(_mm_cvtsi32_si128((uint32_t)last7),_mm_cvtsi32_si128((uint32_t)(last7 >> 32)));
	v13 = _mm_xor_si128(v13, _mm_slli_si128(mi, 8));
	sipcompress()
	sipcompress()
	v02 = _mm_xor_si128(v02, mi);
	v02 = _mm_xor_si128(v02, siphash_final.v);
	sipcompress()
	sipcompress()
	sipcompress()
	sipcompress()

	v02 = _mm_xor_si128(v02, v13);
	v02 = _mm_xor_si128(v02, _mm_shuffle_epi32(v02, _MM_SHUFFLE(1,0,3,2)));
	lo = _mm_cvtsi128_si32(v02);
	hi = _mm_cvtsi128_si32(_mm_srli_si128(v02, 4));
	return ((uint64_t)hi << 32) | lo;
}